

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  long lVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_io_methods *psVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  sqlite3_io_methods *p;
  void *pvVar10;
  ulong uVar11;
  size_t sVar12;
  _func_int_sqlite3_file_ptr_sqlite3_int64 *__s;
  sqlite3_mutex *psVar13;
  ulong uVar14;
  sqlite3_uint64 sVar15;
  code *zBuf;
  char *zFunc;
  char *pcVar16;
  int iVar17;
  long lVar18;
  short local_d8;
  int local_c4;
  stat sStat;
  
  uVar5 = (*aSyscall[0x19].pCurrent)();
  uVar9 = 1;
  if (0x7fff < (int)uVar5) {
    uVar9 = (ulong)(uVar5 >> 0xf);
  }
  if (fd[8].pMethods == (sqlite3_io_methods *)0x0) {
    p = (sqlite3_io_methods *)sqlite3_malloc64(0x18);
    if (p == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    *(undefined8 *)p = 0;
    p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    unixEnterMutex();
    psVar2 = fd[2].pMethods;
    __s = psVar2->xTruncate;
    if (__s != (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) goto LAB_001224c4;
    psVar3 = fd[7].pMethods;
    iVar17 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
    iVar8 = 0x70a;
    if (iVar17 != 0) goto LAB_001225f8;
    sVar12 = strlen((char *)psVar3);
    sVar15 = (long)(int)sVar12 + 0x46;
    __s = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)sqlite3_malloc64(sVar15);
    iVar8 = 7;
    if (__s == (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) goto LAB_001225f8;
    memset(__s,0,sVar15);
    zBuf = __s + 0x40;
    *(code **)(__s + 0x10) = zBuf;
    sqlite3_snprintf((int)sVar12 + 6,(char *)zBuf,"%s-shm",psVar3);
    *(undefined4 *)(__s + 0x18) = 0xffffffff;
    psVar3 = fd[2].pMethods;
    psVar3->xTruncate = __s;
    *(sqlite3_io_methods **)__s = psVar3;
    if (sqlite3Config.bCoreMutex != 0) {
      psVar13 = sqlite3_mutex_alloc(0);
      *(sqlite3_mutex **)(__s + 8) = psVar13;
      if (psVar13 == (sqlite3_mutex *)0x0) goto LAB_001225f8;
    }
    if (*(char *)((long)&psVar2->xRead + 5) == '\0') {
      iVar17 = 0;
      iVar8 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
      if (iVar8 == 0) {
        iVar17 = 0x42;
      }
      else {
        __s[0x22] = (code)0x1;
      }
      uVar5 = robust_open((char *)zBuf,iVar17,sStat.st_mode & 0x1ff);
      *(uint *)(__s + 0x18) = uVar5;
      if ((int)uVar5 < 0) {
        iVar8 = sqlite3CantopenError(0x87ac);
        pcVar16 = "open";
        iVar17 = 0x87ac;
      }
      else {
        iVar8 = (*aSyscall[0x15].pCurrent)();
        if (iVar8 == 0) {
          (*aSyscall[0x14].pCurrent)((ulong)uVar5,sStat.st_uid,sStat.st_gid);
        }
        iVar8 = unixShmSystemLock((unixFile *)fd,1,0x80,1);
        if ((iVar8 != 0) || (iVar8 = robust_ftruncate(*(int *)(__s + 0x18),0), iVar8 == 0)) {
          iVar8 = unixShmSystemLock((unixFile *)fd,0,0x80,1);
          if (iVar8 != 0) goto LAB_001225f8;
          goto LAB_001224c4;
        }
        pcVar16 = "ftruncate";
        iVar8 = 0x120a;
        iVar17 = 0x87bc;
      }
      unixLogErrorAtLine(iVar8,pcVar16,(char *)zBuf,iVar17);
LAB_001225f8:
      unixShmPurge((unixFile *)fd);
      sqlite3_free(p);
      unixLeaveMutex();
      return iVar8;
    }
LAB_001224c4:
    *(_func_int_sqlite3_file_ptr_sqlite3_int64 **)p = __s;
    *(int *)(__s + 0x30) = *(int *)(__s + 0x30) + 1;
    fd[8].pMethods = p;
    unixLeaveMutex();
    if (*(sqlite3_mutex **)(__s + 8) == (sqlite3_mutex *)0x0) {
      psVar13 = (sqlite3_mutex *)0x0;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(__s + 8));
      psVar13 = *(sqlite3_mutex **)(__s + 8);
    }
    p->xClose = *(_func_int_sqlite3_file_ptr **)(__s + 0x38);
    *(sqlite3_io_methods **)(__s + 0x38) = p;
    if (psVar13 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar13);
    }
  }
  lVar1 = *(long *)fd[8].pMethods;
  if (*(sqlite3_mutex **)(lVar1 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 8));
  }
  iVar8 = (int)uVar9;
  iVar17 = (iVar8 + iRegion) - (iVar8 + iRegion) % iVar8;
  uVar4 = *(ushort *)(lVar1 + 0x20);
  iVar7 = 0;
  if (iVar17 <= (int)(uint)uVar4) goto LAB_0012275b;
  *(int *)(lVar1 + 0x1c) = szRegion;
  if ((int)*(uint *)(lVar1 + 0x18) < 0) {
LAB_001224f2:
    pvVar10 = sqlite3_realloc(*(void **)(lVar1 + 0x28),iVar17 * 8);
    if (pvVar10 == (void *)0x0) {
      iVar7 = 0xc0a;
    }
    else {
      *(void **)(lVar1 + 0x28) = pvVar10;
      sVar15 = (sqlite3_uint64)szRegion;
      iVar7 = 0;
      uVar14 = uVar9;
      if (iVar8 == 0) {
        uVar14 = 0;
      }
      uVar4 = *(ushort *)(lVar1 + 0x20);
      while ((int)(uint)uVar4 < iVar17) {
        if (-1 < (int)*(uint *)(lVar1 + 0x18)) {
          pvVar10 = (void *)(*aSyscall[0x16].pCurrent)
                                      (0,(long)(szRegion * iVar8),
                                       (ulong)((uint)(*(char *)(lVar1 + 0x22) == '\0') * 2 + 1),1,
                                       (ulong)*(uint *)(lVar1 + 0x18),uVar4 * sVar15);
          if (pvVar10 != (void *)0xffffffffffffffff) goto LAB_0012259e;
          pcVar16 = *(char **)(lVar1 + 0x10);
          zFunc = "mmap";
          iVar7 = 0x150a;
          iVar17 = 0x150a;
          iVar8 = 0x885b;
LAB_00122748:
          unixLogErrorAtLine(iVar17,zFunc,pcVar16,iVar8);
          break;
        }
        pvVar10 = sqlite3_malloc64(sVar15);
        if (pvVar10 == (void *)0x0) {
          iVar7 = 7;
          break;
        }
        memset(pvVar10,0,sVar15);
LAB_0012259e:
        for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
          *(void **)(*(long *)(lVar1 + 0x28) +
                    (ulong)((uint)*(ushort *)(lVar1 + 0x20) + (int)uVar11) * 8) = pvVar10;
          pvVar10 = (void *)((long)pvVar10 + sVar15);
        }
        local_d8 = (short)uVar9;
        uVar4 = *(short *)(lVar1 + 0x20) + local_d8;
        *(ushort *)(lVar1 + 0x20) = uVar4;
      }
    }
  }
  else {
    iVar6 = (*aSyscall[5].pCurrent)((ulong)*(uint *)(lVar1 + 0x18),&sStat);
    iVar7 = 0x130a;
    if (iVar6 == 0) {
      if (sStat.st_size < iVar17 * szRegion) {
        if (bExtend == 0) {
          iVar7 = 0;
          goto LAB_0012274d;
        }
        lVar18 = (long)(int)(sStat.st_size / 0x1000);
        uVar14 = lVar18 << 0xc | 0xfff;
        for (; lVar18 < (iVar17 * szRegion) / 0x1000; lVar18 = lVar18 + 1) {
          iVar7 = seekAndWriteFd(*(int *)(lVar1 + 0x18),uVar14,"",1,&local_c4);
          if (iVar7 != 1) {
            pcVar16 = *(char **)(lVar1 + 0x10);
            zFunc = "write";
            iVar7 = 0x130a;
            iVar17 = 0x130a;
            iVar8 = 0x8840;
            goto LAB_00122748;
          }
          uVar14 = uVar14 + 0x1000;
        }
      }
      goto LAB_001224f2;
    }
  }
LAB_0012274d:
  uVar4 = *(ushort *)(lVar1 + 0x20);
LAB_0012275b:
  if (iRegion < (int)(uint)uVar4) {
    pvVar10 = *(void **)(*(long *)(lVar1 + 0x28) + (long)iRegion * 8);
  }
  else {
    pvVar10 = (void *)0x0;
  }
  *pp = pvVar10;
  iVar8 = 8;
  if (*(char *)(lVar1 + 0x22) == '\0') {
    iVar8 = iVar7;
  }
  if (iVar7 != 0) {
    iVar8 = iVar7;
  }
  if (*(sqlite3_mutex **)(lVar1 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar1 + 8));
  }
  return iVar8;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->mutex);
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->h>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->h<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->h>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->h, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->h, iPg*pgsz + pgsz-1, "", 1, &x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->h>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->h, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(szRegion);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, szRegion);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->mutex);
  return rc;
}